

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall
MODEL3D::three_dim_model::co_ord_to_path(three_dim_model *this,co_ord *in_vec,Path *out_path)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  Path holder_path;
  value_type local_58;
  _Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar2 = (in_vec->y).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar1 = (in_vec->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  for (piVar3 = (in_vec->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    local_58.X = (cInt)*piVar3;
    local_58.Y = (cInt)*piVar2;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&local_48,
               &local_58);
    piVar2 = piVar2 + 1;
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
            (out_path,(vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                      &local_48);
  std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void MODEL3D::three_dim_model::co_ord_to_path(  const co_ord &in_vec,
                                                ClipperLib::Path &out_path)
{
    // for each point convert to clipper point
    // then push point to path
    ClipperLib::Path holder_path;
    auto point_it_y = in_vec.y.begin();
    auto point_it_x_end = in_vec.x.end();
    for (auto point_it_x = in_vec.x.begin(); point_it_x != point_it_x_end; point_it_x++)
    {
        ClipperLib::IntPoint current_point;
        current_point.X = *point_it_x;
        current_point.Y = *point_it_y;
        holder_path.push_back(current_point);
        point_it_y++;
    }
    out_path = holder_path;
}